

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

uint32 Js::ArrayBuffer::ToIndex
                 (Var value,int32 errorCode,ScriptContext *scriptContext,uint32 MaxAllowedLength,
                 bool checkSameValueZero)

{
  bool bVar1;
  BOOL BVar2;
  Var aValue;
  int64 iVar3;
  Var bValue;
  double value_00;
  Var index_1;
  Var integerIndex;
  double d;
  int64 index;
  bool checkSameValueZero_local;
  uint32 MaxAllowedLength_local;
  ScriptContext *scriptContext_local;
  int32 errorCode_local;
  Var value_local;
  
  BVar2 = Js::JavascriptOperators::IsUndefined(value);
  if (BVar2 == 0) {
    bVar1 = TaggedInt::Is(value);
    if (bVar1) {
      iVar3 = TaggedInt::ToInt64(value);
      if ((iVar3 < 0) || ((long)(ulong)MaxAllowedLength < iVar3)) {
        JavascriptError::ThrowRangeError(scriptContext,errorCode,(PCWSTR)0x0);
      }
      value_local._4_4_ = (uint32)iVar3;
    }
    else {
      value_00 = JavascriptConversion::ToInteger(value,scriptContext);
      if ((value_00 < 0.0) || ((double)MaxAllowedLength < value_00)) {
        JavascriptError::ThrowRangeError(scriptContext,errorCode,(PCWSTR)0x0);
      }
      if (checkSameValueZero) {
        aValue = JavascriptNumber::ToVarNoCheck(value_00,scriptContext);
        iVar3 = JavascriptConversion::ToLength(aValue,scriptContext);
        bValue = JavascriptNumber::ToVar(iVar3,scriptContext);
        bVar1 = JavascriptConversion::SameValueZero(aValue,bValue);
        if (!bVar1) {
          JavascriptError::ThrowRangeError(scriptContext,errorCode,(PCWSTR)0x0);
        }
      }
      value_local._4_4_ = (uint32)(long)value_00;
    }
  }
  else {
    value_local._4_4_ = 0;
  }
  return value_local._4_4_;
}

Assistant:

uint32 ArrayBuffer::ToIndex(Var value, int32 errorCode, ScriptContext *scriptContext, uint32 MaxAllowedLength, bool checkSameValueZero)
    {
        if (JavascriptOperators::IsUndefined(value))
        {
            return 0;
        }

        if (TaggedInt::Is(value))
        {
            int64 index = TaggedInt::ToInt64(value);
            if (index < 0 || index >(int64)MaxAllowedLength)
            {
                JavascriptError::ThrowRangeError(scriptContext, errorCode);
            }

            return  (uint32)index;
        }

        // Slower path

        double d = JavascriptConversion::ToInteger(value, scriptContext);
        if (d < 0.0 || d >(double)MaxAllowedLength)
        {
            JavascriptError::ThrowRangeError(scriptContext, errorCode);
        }

        if (checkSameValueZero)
        {
            Var integerIndex = JavascriptNumber::ToVarNoCheck(d, scriptContext);
            Var index = JavascriptNumber::ToVar(JavascriptConversion::ToLength(integerIndex, scriptContext), scriptContext);
            if (!JavascriptConversion::SameValueZero(integerIndex, index))
            {
                JavascriptError::ThrowRangeError(scriptContext, errorCode);
            }
        }

        return (uint32)d;
    }